

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# th.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint64_t uVar2;
  void *pvVar3;
  char **in_RSI;
  int in_EDI;
  int unaff_retaddr;
  int i_2;
  int i_1;
  int i;
  int opt;
  undefined4 in_stack_00000024;
  uint local_20;
  uint local_1c;
  uint local_18;
  int local_4;
  
  while( true ) {
    iVar1 = getopt(in_EDI,in_RSI,"a:");
    if (iVar1 == -1) {
      if (_optind < in_EDI) {
        fprintf(_stderr,"%s: unknown arg \'%s\'\n",*in_RSI,in_RSI[_optind]);
        local_4 = 1;
      }
      else {
        randomize(0x1012d9);
        for (local_18 = 0; local_18 < 1000; local_18 = local_18 + 1) {
          uVar2 = rnd64();
          the1000[(int)local_18] = uVar2;
        }
        for (local_1c = 0; local_1c < 1000; local_1c = local_1c + 1) {
          pvVar3 = malloc((the1000[(int)local_1c] & 0xffff) + 1);
          the1000p[(int)local_1c] = pvVar3;
        }
        nthreads = nproc();
        if (nthreads == 0) {
          nthreads = 8;
        }
        nwthreads = nthreads >> 1;
        if (nwthreads == 0) {
          nwthreads = 1;
        }
        nrthreads = nthreads - nwthreads;
        if (nrthreads == 0) {
          nrthreads = 1;
        }
        printf("Using %zu threads; %zu readers %zu writers in mixed tests.\n",nthreads,nrthreads,
               nwthreads);
        test((char *)CONCAT44(in_stack_00000024,argc),argv._4_4_,(int)argv,_i,_i_2,unaff_retaddr);
        test((char *)CONCAT44(in_stack_00000024,argc),argv._4_4_,(int)argv,_i,_i_2,unaff_retaddr);
        test((char *)CONCAT44(in_stack_00000024,argc),argv._4_4_,(int)argv,_i,_i_2,unaff_retaddr);
        test((char *)CONCAT44(in_stack_00000024,argc),argv._4_4_,(int)argv,_i,_i_2,unaff_retaddr);
        test((char *)CONCAT44(in_stack_00000024,argc),argv._4_4_,(int)argv,_i,_i_2,unaff_retaddr);
        test((char *)CONCAT44(in_stack_00000024,argc),argv._4_4_,(int)argv,_i,_i_2,unaff_retaddr);
        test((char *)CONCAT44(in_stack_00000024,argc),argv._4_4_,(int)argv,_i,_i_2,unaff_retaddr);
        test((char *)CONCAT44(in_stack_00000024,argc),argv._4_4_,(int)argv,_i,_i_2,unaff_retaddr);
        test((char *)CONCAT44(in_stack_00000024,argc),argv._4_4_,(int)argv,_i,_i_2,unaff_retaddr);
        test((char *)CONCAT44(in_stack_00000024,argc),argv._4_4_,(int)argv,_i,_i_2,unaff_retaddr);
        test((char *)CONCAT44(in_stack_00000024,argc),argv._4_4_,(int)argv,_i,_i_2,unaff_retaddr);
        test((char *)CONCAT44(in_stack_00000024,argc),argv._4_4_,(int)argv,_i,_i_2,unaff_retaddr);
        test((char *)CONCAT44(in_stack_00000024,argc),argv._4_4_,(int)argv,_i,_i_2,unaff_retaddr);
        for (local_20 = 0; local_20 < 1000; local_20 = local_20 + 1) {
          free(the1000p[(int)local_20]);
        }
        local_4 = any_bad;
      }
      return local_4;
    }
    if (iVar1 != 0x61) break;
    only_hm = atoi(_optarg);
  }
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    int opt;
    while ((opt = getopt(argc, argv, "a:")) != -1)
    {
        switch (opt)
        {
        case 'a':
            only_hm = atoi(optarg);
            break;
        default:
            exit(1);
        }
    }
    if (optind < argc)
        return fprintf(stderr, "%s: unknown arg '%s'\n", argv[0], argv[optind]), 1;

    randomize(0);
    for (int i=0; i<ARRAYSZ(the1000); i++)
        the1000[i] = rnd64();
    for (int i=0; i<ARRAYSZ(the1000p); i++)
        the1000p[i] = malloc(the1000[i]%65536+1);

    nthreads = nproc();
    if (!nthreads)
        nthreads = 8;
    nwthreads=nthreads/2;
    if (!nwthreads)
        nwthreads = 1;
    nrthreads=nthreads-nwthreads;
    if (!nrthreads)
        nrthreads = 1;
    printf("Using %zu threads; %zu readers %zu writers in mixed tests.\n",
        nthreads, nrthreads, nwthreads);
    test("read 1-of-1", 1, 0, thread_read1, 0, 0);
    test("read 1-of-2", 2, 0, thread_read1, 0, 0);
    test("read 1-of-1000", 1, 1000, thread_read1, 0, 0);
    test("read 1000-of-1000", 0, 1000, thread_read1000, 0, 0);
    test("read 1-of-1000 pointers", 0, -1000, thread_read1p, 0, 0);
#if __SIZEOF_SIZE_T__ == 8
    // These tests are slightly buggy: the 1000*nwthreads random values
    // must be unique, which I didn't bothered to check as the chance of
    // collision on 64-bit is negligible, esp. with CI being unreliable.
    // Enter 32-bit...
    // The library code is correct, just the tests are wrong.
    test("read 1 write 1000", 1, 0, thread_read1, thread_write1000, 0);
    test("read 1000 write 1000", 0, 1000, thread_read1000, thread_write1000, 0);
    test("read-write-remove", 0, 0, thread_read_write_remove, (thread_func_t)-1, 0);
#endif
    test("read 1-of-1 cachekiller", 1, 0, thread_read1_cachekiller, 0, 0);
    test("read 1-of-1000 cachekiller", 1, 1000, thread_read1_cachekiller, 0, 0);
#if __SIZEOF_SIZE_T__ == 8
    test("read 1000 write 1000 cachekiller", 0, 1000, thread_read1000_cachekiller, thread_write1000_cachekiller, 0);
#endif
    test("le 1 van der Corput", 1, 0, thread_le1, 0, 2);
    test("le 1000 van der Corput", 0, 1000, thread_le1000, 0, 2);

    for (int i=0; i<ARRAYSZ(the1000p); i++)
        free(the1000p[i]);
    return any_bad;
}